

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::LoadModifications(cmCTestP4 *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> p4_diff;
  string source;
  OutputLogger err;
  DiffParser out;
  
  p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&p4_diff);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_2fd6a9;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_diff,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_2fd6b4;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_diff,(char **)&out);
  std::operator+(&source,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)source._M_dataplus._M_p
  ;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_diff,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_diff,(char **)&out);
  DiffParser::DiffParser(&out,this,"p4_diff-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_diff-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,
                      p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                      (OutputParser *)&err,(char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  DiffParser::~DiffParser(&out);
  std::__cxx11::string::~string((string *)&source);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return true;
}

Assistant:

bool cmCTestP4::LoadModifications()
{
  std::vector<char const*> p4_diff;
  this->SetP4Options(p4_diff);

  p4_diff.push_back("diff");

  // Ideally we would use -Od but not all clients support it
  p4_diff.push_back("-dn");
  std::string source = this->SourceDirectory + "/...";
  p4_diff.push_back(source.c_str());
  p4_diff.push_back(nullptr);

  DiffParser out(this, "p4_diff-out> ");
  OutputLogger err(this->Log, "p4_diff-err> ");
  this->RunChild(p4_diff.data(), &out, &err);
  return true;
}